

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O2

shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> __thiscall
skiwi::make_deep_copy<skiwi::alpha_conversion_data>
          (skiwi *this,shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *env)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  skiwi *this_00;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> sVar2;
  __shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if ((env->
      super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr == (element_type *)0x0) {
    std::__shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
                    *)this,&env->
                            super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
                  );
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    sVar2 = std::
            make_shared<skiwi::environment<skiwi::alpha_conversion_data>,skiwi::environment<skiwi::alpha_conversion_data>&>
                      ((environment<skiwi::alpha_conversion_data> *)this);
    _Var1 = sVar2.
            super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
    this_00 = this;
    while (*(long *)(*(long *)&this_00->field_0x0 + 0x30) != 0) {
      this_00 = (skiwi *)(*(long *)&this_00->field_0x0 + 0x30);
      std::
      make_shared<skiwi::environment<skiwi::alpha_conversion_data>,std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>>&>
                ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)&local_30);
      std::
      __shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>::
      operator=((__shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
                 *)this_00,&local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
      _Var1._M_pi = extraout_RDX;
    }
  }
  sVar2.
  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.
  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>)
         sVar2.
         super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<environment<TEntry>> make_deep_copy(const std::shared_ptr<environment<TEntry>>& env)
  {
  if (!env.get())
    return env;
  std::shared_ptr<environment<TEntry>> out = std::make_shared<environment<TEntry>>(*env);
  //if (out->p_outer)
  //  out->p_outer = make_deep_copy(out->p_outer);
  auto* p_outer_copy = &(out->p_outer);
  while (*p_outer_copy)
    { // this loop is not tested anywhere yet
    *p_outer_copy = std::make_shared<environment<TEntry>>(*p_outer_copy);
    p_outer_copy = &((*p_outer_copy)->p_outer);
    }
  return out;
  }